

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int ncnn::reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int i_1;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int q_1;
  uint uVar16;
  ulong uVar17;
  int q;
  uint _w;
  float fVar18;
  int local_d0;
  Mat sums;
  Mat local_78;
  void *local_38;
  
  sVar2 = a->elemsize;
  iVar9 = a->dims;
  if (iVar9 == 3) {
    uVar5 = a->w;
    lVar12 = (long)(int)uVar5;
    uVar16 = a->h;
    _w = a->c;
    uVar15 = uVar16 * uVar5;
    bVar4 = !reduce_h;
    if ((reduce_w && !bVar4) && reduce_c) {
      Mat::create(b,1,1,1,sVar2,opt->blob_allocator);
      Mat::Mat(&sums,_w,sVar2,opt->workspace_allocator);
      local_d0 = -100;
      if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
        uVar7 = 0;
        uVar17 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar17 = uVar7;
        }
        uVar13 = (ulong)_w;
        if ((int)_w < 1) {
          uVar13 = uVar7;
        }
        for (; uVar7 != uVar13; uVar7 = uVar7 + 1) {
          Mat::channel(&local_78,a,(int)uVar7);
          pvVar6 = local_78.data;
          Mat::~Mat(&local_78);
          fVar18 = 0.0;
          for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
            fVar1 = *(float *)((long)pvVar6 + uVar14 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
          }
          *(float *)((long)sums.data + uVar7 * 4) = fVar18;
        }
        fVar18 = 0.0;
        for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
          fVar18 = fVar18 + *(float *)((long)sums.data + uVar17 * 4);
        }
        *(float *)b->data = fVar18;
        local_d0 = 0;
      }
    }
    else {
      if ((reduce_w && !bVar4) && !reduce_c) {
        Mat::create(b,1,1,_w,sVar2,opt->blob_allocator);
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        if ((int)_w < 1) {
          _w = 0;
        }
        for (uVar5 = 0; uVar5 != _w; uVar5 = uVar5 + 1) {
          Mat::channel(&sums,a,uVar5);
          pvVar6 = sums.data;
          Mat::~Mat(&sums);
          Mat::channel(&sums,b,uVar5);
          pvVar10 = sums.data;
          Mat::~Mat(&sums);
          fVar18 = 0.0;
          for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
            fVar1 = *(float *)((long)pvVar6 + uVar17 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
          }
          *(float *)pvVar10 = fVar18;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && !reduce_c) {
        Mat::create(b,1,uVar16,_w,sVar2,opt->blob_allocator);
        uVar17 = 0;
        if (0 < (int)uVar5) {
          uVar17 = (ulong)uVar5;
        }
        uVar7 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar7 = 0;
        }
        uVar13 = (ulong)_w;
        if ((int)_w < 1) {
          uVar13 = 0;
        }
        iVar9 = 0;
        while (iVar9 != (int)uVar13) {
          Mat::channel(&sums,a,iVar9);
          pvVar6 = sums.data;
          Mat::~Mat(&sums);
          local_38 = (void *)CONCAT44(local_38._4_4_,iVar9);
          Mat::channel(&sums,b,iVar9);
          pvVar10 = sums.data;
          Mat::~Mat(&sums);
          for (uVar14 = 0; uVar14 != uVar7; uVar14 = uVar14 + 1) {
            fVar18 = 0.0;
            for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
              fVar1 = *(float *)((long)pvVar6 + uVar8 * 4);
              fVar18 = fVar18 + fVar1 * fVar1;
            }
            *(float *)((long)pvVar10 + uVar14 * 4) = fVar18;
            pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
          }
          iVar9 = (int)local_38 + 1;
        }
        return 0;
      }
      if ((reduce_w && !reduce_h) && reduce_c) {
        Mat::create(b,1,uVar16,1,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,1,uVar16,_w,sVar2,opt->workspace_allocator);
        local_d0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar7 = 0;
          uVar17 = 0;
          if (0 < (int)uVar5) {
            uVar17 = (ulong)uVar5;
          }
          uVar13 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar13 = uVar7;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          for (; uVar7 != _w; uVar7 = uVar7 + 1) {
            Mat::channel(&local_78,a,(int)uVar7);
            pvVar6 = local_78.data;
            Mat::~Mat(&local_78);
            pvVar10 = (void *)(sums.cstep * uVar7 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            local_78.data = pvVar10;
            Mat::~Mat(&local_78);
            for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
              fVar18 = 0.0;
              for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
                fVar1 = *(float *)((long)pvVar6 + uVar8 * 4);
                fVar18 = fVar18 + fVar1 * fVar1;
              }
              *(float *)((long)pvVar10 + uVar14 * 4) = fVar18;
              pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_d0 = 0;
          for (uVar17 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar6 = sums.data,
              uVar17 != _w; uVar17 = uVar17 + 1) {
            local_78.data = (void *)(sums.cstep * uVar17 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_78);
            pvVar10 = b->data;
            for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
              *(float *)((long)pvVar10 + uVar7 * 4) =
                   *(float *)((long)pvVar6 + uVar7 * 4 + sVar3 * sVar2 * uVar17) +
                   *(float *)((long)pvVar10 + uVar7 * 4);
            }
          }
        }
      }
      else {
        if ((bVar4 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar5,uVar16,1,sVar2,opt->blob_allocator);
            Mat::fill(b,0.0);
            uVar17 = (ulong)uVar15;
            if ((int)uVar15 < 1) {
              uVar17 = 0;
            }
            if ((int)_w < 1) {
              _w = 0;
            }
            for (uVar5 = 0; uVar5 != _w; uVar5 = uVar5 + 1) {
              Mat::channel(&sums,a,uVar5);
              pvVar10 = sums.data;
              Mat::~Mat(&sums);
              pvVar6 = b->data;
              for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
                fVar18 = *(float *)((long)pvVar10 + uVar7 * 4);
                *(float *)((long)pvVar6 + uVar7 * 4) =
                     fVar18 * fVar18 + *(float *)((long)pvVar6 + uVar7 * 4);
              }
            }
            return 0;
          }
          if ((bVar4 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar5,1,_w,sVar2,opt->blob_allocator);
          Mat::fill(b,0.0);
          uVar17 = 0;
          if (0 < (int)uVar5) {
            uVar17 = (ulong)uVar5;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          if ((int)_w < 1) {
            _w = 0;
          }
          uVar5 = 0;
          while (uVar5 != _w) {
            Mat::channel(&sums,a,uVar5);
            pvVar6 = sums.data;
            Mat::~Mat(&sums);
            local_38 = (void *)CONCAT44(local_38._4_4_,uVar5);
            Mat::channel(&sums,b,uVar5);
            pvVar10 = sums.data;
            Mat::~Mat(&sums);
            for (uVar5 = 0; uVar5 != uVar16; uVar5 = uVar5 + 1) {
              for (uVar7 = 0; uVar17 != uVar7; uVar7 = uVar7 + 1) {
                fVar18 = *(float *)((long)pvVar6 + uVar7 * 4);
                *(float *)((long)pvVar10 + uVar7 * 4) =
                     fVar18 * fVar18 + *(float *)((long)pvVar10 + uVar7 * 4);
              }
              pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
            }
            uVar5 = (int)local_38 + 1;
          }
          return 0;
        }
        Mat::create(b,uVar5,1,1,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,uVar5,1,_w,sVar2,opt->workspace_allocator);
        local_d0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          Mat::fill(&sums,0.0);
          uVar17 = 0;
          uVar7 = 0;
          if (0 < (int)uVar5) {
            uVar7 = (ulong)uVar5;
          }
          if ((int)uVar16 < 1) {
            uVar16 = 0;
          }
          uVar13 = (ulong)_w;
          if ((int)_w < 1) {
            uVar13 = uVar17;
          }
          for (; uVar17 != uVar13; uVar17 = uVar17 + 1) {
            Mat::channel(&local_78,a,(int)uVar17);
            pvVar6 = local_78.data;
            Mat::~Mat(&local_78);
            sVar3 = sums.cstep;
            sVar2 = sums.elemsize;
            local_38 = sums.data;
            local_78.data = (void *)(sums.cstep * uVar17 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_78);
            lVar11 = sVar3 * sVar2 * uVar17;
            for (uVar5 = 0; uVar5 != uVar16; uVar5 = uVar5 + 1) {
              for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
                fVar18 = *(float *)((long)pvVar6 + uVar14 * 4);
                *(float *)((long)local_38 + uVar14 * 4 + lVar11) =
                     fVar18 * fVar18 + *(float *)((long)local_38 + uVar14 * 4 + lVar11);
              }
              pvVar6 = (void *)((long)pvVar6 + lVar12 * 4);
            }
          }
          Mat::fill(b,0.0);
          local_d0 = 0;
          for (uVar17 = 0; sVar3 = sums.cstep, sVar2 = sums.elemsize, pvVar6 = sums.data,
              uVar17 != uVar13; uVar17 = uVar17 + 1) {
            local_78.data = (void *)(sums.cstep * uVar17 * sums.elemsize + (long)sums.data);
            local_78.refcount = (int *)0x0;
            local_78.elemsize = sums.elemsize;
            local_78.elempack = sums.elempack;
            local_78.allocator = sums.allocator;
            local_78.dims = 2;
            local_78.w = sums.w;
            local_78.h = sums.h;
            local_78.c = 1;
            local_78.cstep = (size_t)(sums.h * sums.w);
            Mat::~Mat(&local_78);
            pvVar10 = b->data;
            for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
              *(float *)((long)pvVar10 + uVar14 * 4) =
                   *(float *)((long)pvVar6 + uVar14 * 4 + sVar3 * sVar2 * uVar17) +
                   *(float *)((long)pvVar10 + uVar14 * 4);
            }
          }
        }
      }
    }
LAB_001402d8:
    Mat::~Mat(&sums);
  }
  else {
    if (iVar9 == 2) {
      uVar5 = a->w;
      uVar16 = a->h;
      if (reduce_w && reduce_h) {
        Mat::create(b,1,1,sVar2,opt->blob_allocator);
        Mat::Mat(&sums,uVar16,sVar2,opt->workspace_allocator);
        local_d0 = -100;
        if ((sums.data != (void *)0x0) && ((long)sums.c * sums.cstep != 0)) {
          pvVar6 = a->data;
          iVar9 = a->w;
          uVar7 = 0;
          uVar17 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar17 = uVar7;
          }
          uVar13 = (ulong)uVar16;
          if ((int)uVar16 < 1) {
            uVar13 = uVar7;
          }
          sVar2 = a->elemsize;
          for (; fVar18 = 0.0, uVar7 != uVar13; uVar7 = uVar7 + 1) {
            for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
              fVar1 = *(float *)((long)pvVar6 + uVar14 * 4);
              fVar18 = fVar18 + fVar1 * fVar1;
            }
            *(float *)((long)sums.data + uVar7 * 4) = fVar18;
            pvVar6 = (void *)((long)pvVar6 + (long)iVar9 * sVar2);
          }
          for (uVar17 = 0; uVar13 != uVar17; uVar17 = uVar17 + 1) {
            fVar18 = fVar18 + *(float *)((long)sums.data + uVar17 * 4);
          }
          *(float *)b->data = fVar18;
          local_d0 = 0;
        }
        goto LAB_001402d8;
      }
      if (reduce_w && !reduce_h) {
        Mat::create(b,1,uVar16,sVar2,opt->blob_allocator);
        pvVar6 = a->data;
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        iVar9 = a->w;
        uVar17 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar17 = 0;
        }
        pvVar10 = b->data;
        sVar2 = a->elemsize;
        for (uVar7 = 0; uVar7 != uVar17; uVar7 = uVar7 + 1) {
          fVar18 = 0.0;
          for (uVar13 = 0; uVar5 != uVar13; uVar13 = uVar13 + 1) {
            fVar1 = *(float *)((long)pvVar6 + uVar13 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
          }
          *(float *)((long)pvVar10 + uVar7 * 4) = fVar18;
          pvVar6 = (void *)((long)pvVar6 + (long)iVar9 * sVar2);
        }
      }
      else {
        if (!reduce_h || reduce_w) {
          return 0;
        }
        Mat::create(b,uVar5,1,sVar2,opt->blob_allocator);
        Mat::fill(b,0.0);
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        pvVar6 = a->data;
        uVar17 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar17 = 0;
        }
        iVar9 = a->w;
        sVar2 = a->elemsize;
        for (uVar7 = 0; uVar7 != uVar17; uVar7 = uVar7 + 1) {
          pvVar10 = b->data;
          for (uVar13 = 0; uVar5 != uVar13; uVar13 = uVar13 + 1) {
            fVar18 = *(float *)((long)pvVar6 + uVar13 * 4);
            *(float *)((long)pvVar10 + uVar13 * 4) =
                 fVar18 * fVar18 + *(float *)((long)pvVar10 + uVar13 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + (long)iVar9 * sVar2);
        }
      }
    }
    else {
      if (iVar9 != 1) {
        return 0;
      }
      uVar5 = a->w;
      Mat::create(b,1,sVar2,opt->blob_allocator);
      uVar7 = 0;
      uVar17 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar17 = uVar7;
      }
      fVar18 = 0.0;
      for (; uVar17 != uVar7; uVar7 = uVar7 + 1) {
        fVar1 = *(float *)((long)a->data + uVar7 * 4);
        fVar18 = fVar18 + fVar1 * fVar1;
      }
      *(float *)b->data = fVar18;
    }
    local_d0 = 0;
  }
  return local_d0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}